

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-apply.cc
# Opt level: O0

bool tinyusdz::tydra::ApplyToCollection
               (Prim *prim,function<bool_(const_tinyusdz::Collection_*)> *fn)

{
  uint32_t uVar1;
  Model *__args;
  Scope *__args_00;
  GPrim *pGVar2;
  Xform *pXVar3;
  GeomMesh *pGVar4;
  GeomSphere *pGVar5;
  GeomCapsule *pGVar6;
  GeomCube *pGVar7;
  GeomPoints *pGVar8;
  GeomCylinder *pGVar9;
  GeomBasisCurves *pGVar10;
  GeomSubset *pGVar11;
  SphereLight *pSVar12;
  Collection *local_138;
  Collection *local_128;
  Collection *local_118;
  Collection *local_108;
  Collection *local_f8;
  Collection *local_e8;
  Collection *local_d8;
  Collection *local_c8;
  Collection *local_b8;
  Collection *local_a8;
  Collection *local_98;
  SphereLight *v_12;
  GeomSubset *v_11;
  GeomBasisCurves *v_10;
  GeomCylinder *v_9;
  GeomPoints *v_8;
  GeomCube *v_7;
  GeomCapsule *v_6;
  GeomSphere *v_5;
  GeomMesh *v_4;
  Xform *v_3;
  GPrim *v_2;
  Scope *v_1;
  Model *v;
  function<bool_(const_tinyusdz::Collection_*)> *fn_local;
  Prim *prim_local;
  
  uVar1 = Prim::type_id(prim);
  if (((uVar1 < 0x403) || (uVar1 = Prim::type_id(prim), 0x410 < uVar1)) &&
     ((uVar1 = Prim::type_id(prim), uVar1 < 0x600 || (uVar1 = Prim::type_id(prim), 0x609 < uVar1))))
  {
    prim_local._7_1_ = false;
  }
  else {
    __args = Prim::as<tinyusdz::Model>(prim);
    if (__args == (Model *)0x0) {
      __args_00 = Prim::as<tinyusdz::Scope>(prim);
      if (__args_00 == (Scope *)0x0) {
        pGVar2 = Prim::as<tinyusdz::GPrim>(prim);
        if (pGVar2 == (GPrim *)0x0) {
          pXVar3 = Prim::as<tinyusdz::Xform>(prim);
          if (pXVar3 == (Xform *)0x0) {
            pGVar4 = Prim::as<tinyusdz::GeomMesh>(prim);
            if (pGVar4 == (GeomMesh *)0x0) {
              pGVar5 = Prim::as<tinyusdz::GeomSphere>(prim);
              if (pGVar5 == (GeomSphere *)0x0) {
                pGVar6 = Prim::as<tinyusdz::GeomCapsule>(prim);
                if (pGVar6 == (GeomCapsule *)0x0) {
                  pGVar7 = Prim::as<tinyusdz::GeomCube>(prim);
                  if (pGVar7 == (GeomCube *)0x0) {
                    pGVar8 = Prim::as<tinyusdz::GeomPoints>(prim);
                    if (pGVar8 == (GeomPoints *)0x0) {
                      pGVar9 = Prim::as<tinyusdz::GeomCylinder>(prim);
                      if (pGVar9 == (GeomCylinder *)0x0) {
                        pGVar10 = Prim::as<tinyusdz::GeomBasisCurves>(prim);
                        if (pGVar10 == (GeomBasisCurves *)0x0) {
                          pGVar11 = Prim::as<tinyusdz::GeomSubset>(prim);
                          if (pGVar11 == (GeomSubset *)0x0) {
                            pSVar12 = Prim::as<tinyusdz::SphereLight>(prim);
                            if (pSVar12 == (SphereLight *)0x0) {
                              prim_local._7_1_ = false;
                            }
                            else {
                              local_138 = (Collection *)0x0;
                              if (pSVar12 != (SphereLight *)0x0) {
                                local_138 = &(pSVar12->super_BoundableLight).super_Collection;
                              }
                              prim_local._7_1_ =
                                   ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()
                                             (fn,local_138);
                            }
                          }
                          else {
                            local_128 = (Collection *)0x0;
                            if (pGVar11 != (GeomSubset *)0x0) {
                              local_128 = &pGVar11->super_Collection;
                            }
                            prim_local._7_1_ =
                                 ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()
                                           (fn,local_128);
                          }
                        }
                        else {
                          local_118 = (Collection *)0x0;
                          if (pGVar10 != (GeomBasisCurves *)0x0) {
                            local_118 = &(pGVar10->super_GPrim).super_Collection;
                          }
                          prim_local._7_1_ =
                               ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()
                                         (fn,local_118);
                        }
                      }
                      else {
                        local_108 = (Collection *)0x0;
                        if (pGVar9 != (GeomCylinder *)0x0) {
                          local_108 = &(pGVar9->super_GPrim).super_Collection;
                        }
                        prim_local._7_1_ =
                             ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()
                                       (fn,local_108);
                      }
                    }
                    else {
                      local_f8 = (Collection *)0x0;
                      if (pGVar8 != (GeomPoints *)0x0) {
                        local_f8 = &(pGVar8->super_GPrim).super_Collection;
                      }
                      prim_local._7_1_ =
                           ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()
                                     (fn,local_f8);
                    }
                  }
                  else {
                    local_e8 = (Collection *)0x0;
                    if (pGVar7 != (GeomCube *)0x0) {
                      local_e8 = &(pGVar7->super_GPrim).super_Collection;
                    }
                    prim_local._7_1_ =
                         ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()
                                   (fn,local_e8);
                  }
                }
                else {
                  local_d8 = (Collection *)0x0;
                  if (pGVar6 != (GeomCapsule *)0x0) {
                    local_d8 = &(pGVar6->super_GPrim).super_Collection;
                  }
                  prim_local._7_1_ =
                       ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()(fn,local_d8)
                  ;
                }
              }
              else {
                local_c8 = (Collection *)0x0;
                if (pGVar5 != (GeomSphere *)0x0) {
                  local_c8 = &(pGVar5->super_GPrim).super_Collection;
                }
                prim_local._7_1_ =
                     ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()(fn,local_c8);
              }
            }
            else {
              local_b8 = (Collection *)0x0;
              if (pGVar4 != (GeomMesh *)0x0) {
                local_b8 = &(pGVar4->super_GPrim).super_Collection;
              }
              prim_local._7_1_ =
                   ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()(fn,local_b8);
            }
          }
          else {
            local_a8 = (Collection *)0x0;
            if (pXVar3 != (Xform *)0x0) {
              local_a8 = &(pXVar3->super_GPrim).super_Collection;
            }
            prim_local._7_1_ =
                 ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()(fn,local_a8);
          }
        }
        else {
          local_98 = (Collection *)0x0;
          if (pGVar2 != (GPrim *)0x0) {
            local_98 = &pGVar2->super_Collection;
          }
          prim_local._7_1_ =
               ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()(fn,local_98);
        }
      }
      else {
        prim_local._7_1_ =
             ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()
                       (fn,&__args_00->super_Collection);
      }
    }
    else {
      prim_local._7_1_ =
           ::std::function<bool_(const_tinyusdz::Collection_*)>::operator()
                     (fn,&__args->super_Collection);
    }
  }
  return prim_local._7_1_;
}

Assistant:

bool ApplyToCollection(
  const Prim &prim,
  std::function<bool(const Collection *col)> fn) {

  if ((value::TypeId::TYPE_ID_GPRIM <= prim.type_id() &&
      (value::TypeId::TYPE_ID_GEOM_END > prim.type_id()))) {
    // gprim or geomsubset
  } else if ((value::TypeId::TYPE_ID_LUX_BEGIN <= prim.type_id() &&
      (value::TypeId::TYPE_ID_LUX_END > prim.type_id()))) {
    // usdLux
  } else {
    return false;
  }

#define APPLY_FUN(__ty) { \
  const auto *v = prim.as<__ty>(); \
  if (v) { \
    return fn(v); \
  } \
  }

  APPLY_FUN(Model)
  APPLY_FUN(Scope)
  APPLY_FUN(GPrim)
  APPLY_FUN(Xform)
  APPLY_FUN(GeomMesh)
  APPLY_FUN(GeomSphere)
  APPLY_FUN(GeomCapsule)
  APPLY_FUN(GeomCube)
  APPLY_FUN(GeomPoints)
  APPLY_FUN(GeomCylinder)
  APPLY_FUN(GeomBasisCurves)
  APPLY_FUN(GeomSubset)
  APPLY_FUN(SphereLight)

#undef APPLY_FUN

  return false;

}